

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O2

int http_request(http_reply *http,char *host_name,char *port_str,char *http_string,size_t rlen)

{
  addrinfo *paVar1;
  size_t __n;
  bool bVar2;
  http_reply *phVar3;
  uint uVar4;
  int iVar5;
  ssize_t sVar6;
  char *pcVar7;
  __int32_t **pp_Var8;
  ulong uVar9;
  char *pcVar10;
  addrinfo **__pai;
  ulong uVar11;
  int local_d64;
  size_t body_size;
  uint local_d54;
  http_reply *local_d50;
  char *local_d48;
  addrinfo *resolve_array;
  int *local_d38;
  char *local_d30;
  size_t headers_num;
  int http_minor;
  timeval tv;
  phr_chunked_decoder http_decoder;
  size_t msg_size;
  char *http_msg;
  addrinfo local_ce8;
  phr_header headers [100];
  
  tv.tv_sec = (__time_t)timeout;
  tv.tv_usec = 0;
  http_decoder.bytes_left_in_chunk = 0;
  http_decoder.consume_trailer = '\0';
  http_decoder._hex_count = '\0';
  http_decoder._state = '\0';
  http_decoder._11_5_ = 0;
  local_d50 = http;
  if (v_flag != 0) {
    fprintf(_stdout,"%s: connecting to %s:%s\n",pname,host_name,port_str);
  }
  local_ce8.ai_canonname = (char *)0x0;
  local_ce8.ai_next = (addrinfo *)0x0;
  local_ce8.ai_addrlen = 0;
  local_ce8._20_4_ = 0;
  local_ce8.ai_addr = (sockaddr *)0x0;
  local_ce8.ai_socktype = 1;
  local_ce8.ai_protocol = 0;
  local_ce8.ai_flags = 0x28;
  local_ce8.ai_family = 0;
  __pai = &resolve_array;
  uVar4 = getaddrinfo(host_name,port_str,&local_ce8,(addrinfo **)__pai);
  if (uVar4 != 0) {
    fprintf(_stderr,"failed to resolve remote host address %s (err=%d)\n",host_name,(ulong)uVar4);
    return 1;
  }
  while (paVar1 = (addrinfo *)*__pai, paVar1 != (addrinfo *)0x0) {
    local_d64 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
    if (-1 < local_d64) {
      iVar5 = connect(local_d64,paVar1->ai_addr,paVar1->ai_addrlen);
      if (-1 < iVar5) break;
      close(local_d64);
    }
    __pai = &resolve_array->ai_next;
  }
  freeaddrinfo((addrinfo *)resolve_array);
  if (paVar1 == (addrinfo *)0x0) {
    perror("cannot connect");
    return 1;
  }
  setsockopt(local_d64,1,0x14,&tv,0x10);
  setsockopt(local_d64,1,0x15,&tv,0x10);
  sVar6 = send(local_d64,http_string,rlen,0);
  if ((int)(uint)sVar6 < 0) {
    pcVar7 = "cannot send data ";
  }
  else {
    if (((uint)sVar6 & 0x7fffffff) != rlen) {
      fwrite("incomplete send\n",0x10,1,_stderr);
      goto LAB_0010a004;
    }
    pcVar7 = (char *)malloc(0x400);
    phVar3 = local_d50;
    uVar4 = 0;
    while( true ) {
      uVar9 = (ulong)uVar4;
      sVar6 = recv(local_d64,pcVar7 + uVar9,0x400,0);
      iVar5 = (int)sVar6;
      if (iVar5 < 1) break;
      pcVar7 = (char *)realloc(pcVar7,(ulong)(uVar4 + iVar5 + 0x400));
      uVar4 = uVar4 + iVar5;
    }
    if (-1 < iVar5) {
      headers_num = 100;
      local_d38 = &phVar3->status;
      local_d54 = phr_parse_response(pcVar7,uVar9,&http_minor,local_d38,&http_msg,&msg_size,headers,
                                     &headers_num,0);
      if ((int)local_d54 < 0) {
        fwrite("cannot parse response\n",0x16,1,_stderr);
LAB_0010a049:
        close(local_d64);
        return 2;
      }
      local_d30 = pcVar7;
      bVar2 = false;
      local_d48 = (char *)0x0;
      for (uVar11 = 0; pcVar7 = local_d48, uVar11 < headers_num; uVar11 = uVar11 + 1) {
        pcVar7 = headers[uVar11].name;
        pcVar10 = pcVar7;
        for (; __n = headers[uVar11].name_len, pcVar7 < pcVar10 + __n; pcVar7 = pcVar7 + 1) {
          pp_Var8 = __ctype_tolower_loc();
          *pcVar7 = (char)(*pp_Var8)[*pcVar7];
          pcVar10 = headers[uVar11].name;
        }
        iVar5 = strncmp("content-type",pcVar10,__n);
        if (iVar5 == 0) {
          local_d48 = headers[uVar11].value;
          local_d48[headers[uVar11].value_len] = '\0';
          pcVar7 = strchr(local_d48,0x3b);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
          }
        }
        else {
          iVar5 = strncmp("transfer-encoding",pcVar10,__n);
          if ((iVar5 == 0) &&
             (iVar5 = strncmp("chunked",headers[uVar11].value,headers[uVar11].value_len), iVar5 == 0
             )) {
            bVar2 = true;
          }
        }
      }
      uVar11 = (ulong)local_d54;
      if (v_flag != 0) {
        pcVar10 = "missing";
        if (local_d48 != (char *)0x0) {
          pcVar10 = local_d48;
        }
        fprintf(_stdout,"%s: server response status code: %d, MIME header: %s\n",pname,
                (ulong)(uint)*local_d38,pcVar10);
      }
      phVar3 = local_d50;
      local_d50->mime_type = pcVar7;
      pcVar7 = local_d30 + uVar11;
      local_d50->payload = pcVar7;
      body_size = uVar9 - uVar11;
      if (bVar2) {
        uVar9 = phr_decode_chunked(&http_decoder,pcVar7,&body_size);
        if ((int)uVar9 < 0) {
          fprintf(_stderr,"%i cannot decode chunked payload\n",uVar9 & 0xffffffff);
          goto LAB_0010a049;
        }
        pcVar7 = phVar3->payload;
      }
      pcVar7[body_size] = '\0';
      phVar3->bytes = (int)body_size;
      close(local_d64);
      return 0;
    }
    pcVar7 = "error receiving data ";
  }
  perror(pcVar7);
LAB_0010a004:
  close(local_d64);
  return 1;
}

Assistant:

int http_request(struct http_reply *http, const char* host_name, const char *port_str,
                   const char *http_string, size_t rlen)
{
	struct addrinfo hints;
	struct addrinfo *res, *resolve_array;
	int rc, sd, i;

	char *buf;
	int used, bytes, http_chunked;
	int http_minor;
	const char *http_msg;
	size_t msg_size, headers_num, header_size, body_size;
	struct phr_header headers[100];
	struct phr_chunked_decoder http_decoder = {0};
	char *mime_type;
#ifdef WIN32
	int tv=timeout*1000;
#else
	struct timeval tv;
	tv.tv_sec = timeout;
	tv.tv_usec = 0;
#endif

	if (v_flag)
		fprintf(stdout, "%s: connecting to %s:%s\n", pname, host_name, port_str);

	/* resolve name */
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_protocol = 0;
	hints.ai_flags = (AI_ADDRCONFIG | AI_V4MAPPED);
	rc = getaddrinfo(host_name, port_str, &hints, &resolve_array);
	if (rc!=0) {
		fprintf(stderr, "failed to resolve remote host address %s (err=%d)\n", host_name, rc);
		return (1);
	}

	/* getaddrinfo() returns a list of address structures.
		Try each address until we successfully connect.
		If socket (or connect) fails, we close the socket
		and try the next address. */
	for (res = resolve_array;
		res != NULL;
		res = resolve_array->ai_next) {
		sd = socket(res->ai_family, res->ai_socktype, res->ai_protocol);
		if (sd < 0) {
			continue;
		}

		/* connect to server */
		/* The two socket options SO_RCVTIMEO and SO_SNDTIMEO do not work with connect
		connect has a default timeout of 120 */
		rc = connect(sd, res->ai_addr, res->ai_addrlen);
		if (rc < 0) {
			close(sd);
			continue;
		}

		/* connected, exit loop */
		break;
	}

	freeaddrinfo(resolve_array);
	if (!res ) {
		perror("cannot connect");
		return (1);
	}

	setsockopt(sd,SOL_SOCKET, SO_RCVTIMEO,(void *)&tv, sizeof(tv));
	setsockopt(sd,SOL_SOCKET, SO_SNDTIMEO,(void *)&tv, sizeof(tv));

	/* send data */
	rc = send(sd, http_string, rlen, 0);

	if (rc < 0) {
		perror("cannot send data ");
		close(sd);
		return (1);
	}
	else if(rc != rlen)
	{
		fprintf(stderr,"incomplete send\n");
		close(sd);
		return (1);
	}

	/* Get response */
	buf = (char *)malloc(1024);
        used = 0;
        while ((bytes = recv(sd,&buf[used],1024,0)) > 0) {
                used += bytes;
                buf = (char *)realloc(buf, used + 1024);
	}
	if (bytes < 0) {
		perror("error receiving data ");
		close(sd);
		return (1);
	}

	headers_num = sizeof(headers) / sizeof(headers[0]);
	rc = phr_parse_response(buf, used, &http_minor, &http->status,
			&http_msg, &msg_size, headers, &headers_num, 0);
	if (rc < 0) {
		fprintf(stderr,"cannot parse response\n");
		close(sd);
		return (2);
	}
	header_size = rc;

	mime_type = NULL;
	http_chunked = 0;
	for (i = 0; i < headers_num; i++)
	{
		char *ch;
		/* convert to lowercase as some platforms don't have strcasecmp */
		for (ch = (char *)headers[i].name; ch < headers[i].name+headers[i].name_len; ch++)
			*ch = tolower(*ch);

		if (!strncmp("content-type", headers[i].name, headers[i].name_len))
		{
			char *ptr;

			mime_type = (char *)headers[i].value;
			mime_type[headers[i].value_len] = '\0';

			if ((ptr = strchr(mime_type, ';')))
				*ptr = '\0';
		}
		else if (!strncmp("transfer-encoding", headers[i].name, headers[i].name_len) &&
			!strncmp("chunked", headers[i].value, headers[i].value_len))
		{
			http_chunked = 1;
		}
	}

	if (v_flag)
		fprintf(stdout, "%s: server response status code: %d, MIME header: %s\n",
			pname, http->status, mime_type ? mime_type : "missing");

	http->mime_type = mime_type;
	http->payload = buf+header_size;
	body_size = used-header_size;

	if (http_chunked)
	{
		rc = phr_decode_chunked(&http_decoder, http->payload, &body_size);
		if (rc < 0) {
			fprintf(stderr,"%i cannot decode chunked payload\n", rc);
			close(sd);
			return (2);
		}
	}

	http->payload[body_size] = '\0';
	http->bytes = body_size;

#ifdef WIN32
	closesocket(sd);
#else
	close(sd);
#endif
	return (0);
}